

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

void __thiscall
RuntimeObjectSystem::OnFileChange(RuntimeObjectSystem *this,IAUDynArray<const_char_*> *filelist)

{
  ICompilerLogger *pIVar1;
  _Base_ptr __n;
  int iVar2;
  pointer pPVar3;
  pointer ppcVar4;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  _Var5;
  _Base_ptr p_Var6;
  _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_> _Var7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
  pVar11;
  FileToBuild fileToBuild2;
  FileToBuild fileToBuild;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  bool local_80;
  vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_> *local_78;
  uint local_6c;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  _Base_ptr local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  bool local_40;
  IAUDynArray<const_char_*> *local_38;
  
  if (this->m_bAutoCompile == true) {
    pPVar3 = (this->m_Projects).
             super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_Projects).
        super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
        ._M_impl.super__Vector_impl_data._M_finish != pPVar3) {
      uVar8 = 0;
      uVar9 = 0;
      local_38 = filelist;
      do {
        local_78 = &pPVar3->m_BuildFileList;
        if (this->m_bCompiling != false) {
          local_78 = &pPVar3->m_PendingBuildFileList;
        }
        local_78 = local_78 + uVar8 * 0x13;
        pIVar1 = this->m_pCompilerLogger;
        local_6c = uVar9;
        if (pIVar1 != (ICompilerLogger *)0x0) {
          (**(code **)(*(long *)pIVar1 + 0x10))
                    (pIVar1,"FileChangeNotifier triggered recompile with changes to:\n");
        }
        ppcVar4 = (filelist->m_vec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((filelist->m_vec).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != ppcVar4) {
          uVar10 = 0;
          do {
            pPVar3 = (this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _Var5 = std::
                    __find_if<__gnu_cxx::__normal_iterator<FileSystemUtils::Path*,std::vector<FileSystemUtils::Path,std::allocator<FileSystemUtils::Path>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                              (pPVar3[uVar8].m_RuntimeFileList.
                               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               *(pointer *)
                                ((long)&pPVar3[uVar8].m_RuntimeFileList.
                                        super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                        ._M_impl + 8),ppcVar4 + uVar10);
            if (_Var5._M_current !=
                *(pointer *)
                 ((long)&(this->m_Projects).
                         super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8].m_RuntimeFileList.
                         super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                         ._M_impl + 8)) {
              pIVar1 = this->m_pCompilerLogger;
              if (pIVar1 != (ICompilerLogger *)0x0) {
                (**(code **)(*(long *)pIVar1 + 0x10))
                          (pIVar1,"    File %s\n",
                           (filelist->m_vec).
                           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar10]);
              }
              local_a8 = (undefined1  [8])&PTR__Path_001198d8;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_a0,
                         (filelist->m_vec).
                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10],&local_a9);
              local_68 = (undefined1  [8])&PTR__Path_001198d8;
              local_60._M_p = (pointer)&local_50;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_60,local_a0._M_p,local_a0._M_p + local_98._0_8_);
              local_40 = false;
              local_a8 = (undefined1  [8])&PTR__Path_001198d8;
              if (local_a0._M_p != local_98 + 8) {
                operator_delete(local_a0._M_p,local_98._8_8_ + 1);
              }
              FileSystemUtils::Path::Extension_abi_cxx11_((string *)local_a8,(Path *)local_68);
              iVar2 = std::__cxx11::string::compare((char *)local_a8);
              if (local_a8 != (undefined1  [8])local_98) {
                operator_delete((void *)local_a8,local_98._0_8_ + 1);
              }
              if (iVar2 == 0) {
                pVar11 = std::
                         _Rb_tree<FileSystemUtils::Path,_std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>,_std::_Select1st<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                         ::equal_range(&(this->m_Projects).
                                        super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                        m_RuntimeIncludeMap._M_t,(key_type *)local_68);
                for (_Var7 = pVar11.first._M_node; _Var7._M_node != pVar11.second._M_node._M_node;
                    _Var7._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var7._M_node)) {
                  local_a8 = (undefined1  [8])&PTR__Path_001198d8;
                  local_a0._M_p = local_98 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_a0,_Var7._M_node[2]._M_left,
                             (long)&(_Var7._M_node[2]._M_left)->_M_color +
                             (long)&(_Var7._M_node[2]._M_right)->_M_color);
                  local_80 = true;
                  std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
                  push_back(local_78,(value_type *)local_a8);
                  local_a8 = (undefined1  [8])&PTR__Path_001198d8;
                  if (local_a0._M_p != local_98 + 8) {
                    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
                  }
                }
              }
              else {
                std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
                push_back(local_78,(value_type *)local_68);
                pPVar3 = (this->m_Projects).
                         super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar8;
                p_Var6 = *(_Base_ptr *)
                          ((long)&(pPVar3->m_RuntimeSourceDependencyMap)._M_t._M_impl + 0x18);
                while (p_Var6 != (_Rb_tree_node_base *)
                                 ((long)&(pPVar3->m_RuntimeSourceDependencyMap)._M_t._M_impl + 8U))
                {
                  __n = p_Var6[2]._M_right;
                  if ((__n == local_58) &&
                     ((__n == (_Base_ptr)0x0 ||
                      (iVar2 = bcmp(p_Var6[2]._M_left,local_60._M_p,(size_t)__n), iVar2 == 0)))) {
                    local_a8 = (undefined1  [8])&PTR__Path_001198d8;
                    local_a0._M_p = local_98 + 8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_a0,p_Var6[1]._M_parent,
                               (long)&(p_Var6[1]._M_parent)->_M_color +
                               (long)&(p_Var6[1]._M_left)->_M_color);
                    local_80 = false;
                    std::vector<BuildTool::FileToBuild,_std::allocator<BuildTool::FileToBuild>_>::
                    push_back(local_78,(value_type *)local_a8);
                    local_a8 = (undefined1  [8])&PTR__Path_001198d8;
                    if (local_a0._M_p != local_98 + 8) {
                      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
                    }
                  }
                  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
                  pPVar3 = (this->m_Projects).
                           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar8;
                }
              }
              local_68 = (undefined1  [8])&PTR__Path_001198d8;
              filelist = local_38;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_p != &local_50) {
                operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
                filelist = local_38;
              }
            }
            uVar10 = uVar10 + 1;
            ppcVar4 = (filelist->m_vec).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar10 < (ulong)((long)(filelist->m_vec).
                                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4
                                   >> 3));
        }
        uVar9 = local_6c + 1;
        uVar8 = (ulong)(uVar9 & 0xffff);
        pPVar3 = (this->m_Projects).
                 super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = ((long)(this->m_Projects).
                        super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 3) *
                 -0x7dc11f7047dc11f7;
      } while (uVar8 <= uVar10 && uVar10 - uVar8 != 0);
    }
    if (this->m_bCompiling == false) {
      StartRecompile(this);
    }
  }
  return;
}

Assistant:

void RuntimeObjectSystem::OnFileChange(const IAUDynArray<const char*>& filelist)
{
	if( !m_bAutoCompile )
	{
		return;
	}

    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {

        std::vector<BuildTool::FileToBuild>* pBuildFileList = &m_Projects[ proj ].m_BuildFileList;
        if( m_bCompiling )
        {
            pBuildFileList = &m_Projects[ proj ].m_PendingBuildFileList;
        }


        if (m_pCompilerLogger) { m_pCompilerLogger->LogInfo( "FileChangeNotifier triggered recompile with changes to:\n" ); }
        for( size_t i = 0; i < filelist.Size(); ++i )
        {
            // check this file is in our project list
            TFileList::iterator it = std::find( m_Projects[ proj ].m_RuntimeFileList.begin( ), m_Projects[ proj ].m_RuntimeFileList.end( ), filelist[i] );
            if( it == m_Projects[ proj ].m_RuntimeFileList.end() )
            {
                continue;
            }

            if (m_pCompilerLogger) { m_pCompilerLogger->LogInfo( "    File %s\n", filelist[ i ] ); }
            BuildTool::FileToBuild fileToBuild( filelist[ i ] );

            bool bFindIncludeDependencies = true;  // if this is a header or a source dependency need to find include dependencies
            bool bForceIncludeDependencies = true;
            if( fileToBuild.filePath.Extension() != ".h" ) //TODO: change to check for .cpp and .c as could have .inc files etc.?
            {
                bFindIncludeDependencies = false;
                pBuildFileList->push_back( fileToBuild );

                // file may be a source dependency, check
                TFileToFilesIterator itrCurr = m_Projects[ proj ].m_RuntimeSourceDependencyMap.begin( );
                while( itrCurr != m_Projects[ proj ].m_RuntimeSourceDependencyMap.end( ) )
                {
                    if( itrCurr->second == fileToBuild.filePath )
                    {
                        BuildTool::FileToBuild fileToBuild2( itrCurr->first );
                        pBuildFileList->push_back( fileToBuild2 );
                    }
                    ++itrCurr;
                }
           }

            if( bFindIncludeDependencies )
            {
                TFileToFilesEqualRange range = m_Projects[ proj ].m_RuntimeIncludeMap.equal_range( fileToBuild.filePath );
                for( TFileToFilesIterator it2 = range.first; it2 != range.second; ++it2 )
                {
                    BuildTool::FileToBuild fileToBuildFromIncludes( ( *it2 ).second, bForceIncludeDependencies );
                    pBuildFileList->push_back( fileToBuildFromIncludes );
                }
            }
        }
    }

	if( !m_bCompiling )
	{
		StartRecompile();
	}
}